

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O2

void runsign(runcxdef *ctx,int err)

{
  int iVar1;
  dbgcxdef *ctx_00;
  
  ctx_00 = ctx->runcxdbg;
  if (ctx_00->dbgcxfcn != 0) {
    iVar1 = dbgu_err_resume(ctx_00);
    if (iVar1 != 0) goto LAB_00132cd9;
    ctx_00 = ctx->runcxdbg;
  }
  dbgss(ctx_00,ctx->runcxlofs,0x4e,err,(uchar **)0x0);
LAB_00132cd9:
  errsign(ctx->runcxerr,err,"TADS");
}

Assistant:

NORETURN void runsign(runcxdef *ctx, int err)
{
    /*
     *   If the debugger isn't capable of resuming from a run-time error,
     *   trap to the debugger now so that the user can see what happened.
     *   Do not trap to the debugger here if the debugger can resume from
     *   an error; instead, we'll trap in the p-code loop, since we'll be
     *   able to resume execution from the point of the error.
     *   
     *   Note that we can't resume from an error when there's no stack
     *   frame, so we'll trap to the debugger here in that case.  
     */
    if (ctx->runcxdbg->dbgcxfcn == 0
        || !dbgu_err_resume(ctx->runcxdbg))
        dbgssi(ctx->runcxdbg, ctx->runcxlofs, OPCLINE, err, 0);

    /* signal the error */
    errsign(ctx->runcxerr, err, "TADS");
}